

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O2

void jpgd::jpeg_decoder::decode_block_dc_refine
               (jpeg_decoder *pD,int component_id,int block_x,int block_y)

{
  uint uVar1;
  ushort *puVar2;
  
  uVar1 = get_bits_no_markers(pD,1);
  if (uVar1 != 0) {
    puVar2 = (ushort *)coeff_buf_getp(pD,pD->m_dc_coeffs[component_id],block_x,block_y);
    *puVar2 = *puVar2 | (ushort)(1 << ((byte)pD->m_successive_low & 0x1f));
  }
  return;
}

Assistant:

void jpeg_decoder::decode_block_dc_refine(jpeg_decoder* pD, int component_id, int block_x, int block_y)
	{
		if (pD->get_bits_no_markers(1))
		{
			jpgd_block_coeff_t* p = pD->coeff_buf_getp(pD->m_dc_coeffs[component_id], block_x, block_y);

			p[0] |= (1 << pD->m_successive_low);
		}
	}